

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall CTcParser::clear_local_ctx(CTcParser *this)

{
  CTcParser *this_local;
  
  this->field_0x1e8 = this->field_0x1e8 & 0xfe;
  this->local_ctx_var_num_ = 0;
  this->ctx_var_props_used_ = 0;
  this->next_ctx_arr_idx_ = 2;
  this->self_referenced_ = 0;
  this->full_method_ctx_referenced_ = 0;
  this->local_ctx_needs_self_ = 0;
  this->local_ctx_needs_full_method_ctx_ = 0;
  return;
}

Assistant:

void CTcParser::clear_local_ctx()
{
    /* we don't have a local context */
    has_local_ctx_ = FALSE;

    /* there is no local context local yet */
    local_ctx_var_num_ = 0;

    /* no variable properties are used */
    ctx_var_props_used_ = 0;

    /* 
     *   start the context array index at the next entry after the slot we
     *   always use to store the method context of the enclosing lexical
     *   scope 
     */
    next_ctx_arr_idx_ = TCPRS_LOCAL_CTX_METHODCTX + 1;

    /* we haven't yet referenced 'self' or any other method context yet */
    self_referenced_ = FALSE;
    full_method_ctx_referenced_ = FALSE;

    /* we don't yet need the method context in the local context */
    local_ctx_needs_self_ = FALSE;
    local_ctx_needs_full_method_ctx_ = FALSE;
}